

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

string * __thiscall
cmMakefile::GetModulesFile_abi_cxx11_
          (string *__return_storage_ptr__,cmMakefile *this,char *filename)

{
  bool bVar1;
  PolicyStatus PVar2;
  char *pcVar3;
  reference pbVar4;
  string *psVar5;
  ulong uVar6;
  ostream *poVar7;
  PolicyID id;
  bool local_3b9;
  string local_350;
  string local_330;
  undefined1 local_310 [8];
  ostringstream e;
  allocator local_191;
  string local_190;
  undefined1 local_170 [8];
  string mods;
  string local_148;
  char *local_128;
  char *currentFile;
  undefined1 local_118 [8];
  string itempl;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f0;
  iterator i;
  string local_e0;
  undefined1 local_c0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  modulePath;
  allocator local_91;
  string local_90;
  char *local_70;
  char *cmakeModulePath;
  string moduleInCMakeModulePath;
  string moduleInCMakeRoot;
  char *filename_local;
  cmMakefile *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)(moduleInCMakeModulePath.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&cmakeModulePath);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"CMAKE_MODULE_PATH",&local_91);
  pcVar3 = GetDefinition(this,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  local_70 = pcVar3;
  if (pcVar3 != (char *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_c0);
    pcVar3 = local_70;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e0,pcVar3,(allocator *)((long)&i._M_current + 7));
    cmSystemTools::ExpandListArgument
              (&local_e0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_c0,false);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i._M_current + 7));
    local_f0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_c0);
    while( true ) {
      itempl.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_c0);
      bVar1 = __gnu_cxx::operator!=
                        (&local_f0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&itempl.field_2 + 8));
      if (!bVar1) break;
      pbVar4 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_f0);
      std::__cxx11::string::string((string *)local_118,(string *)pbVar4);
      cmsys::SystemTools::ConvertToUnixSlashes((string *)local_118);
      std::__cxx11::string::operator+=((string *)local_118,"/");
      std::__cxx11::string::operator+=((string *)local_118,filename);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      bVar1 = cmsys::SystemTools::FileExists(pcVar3);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)&cmakeModulePath,(string *)local_118);
        currentFile._4_4_ = 2;
      }
      else {
        currentFile._4_4_ = 0;
      }
      std::__cxx11::string::~string((string *)local_118);
      if (currentFile._4_4_ != 0) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_f0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_c0);
  }
  psVar5 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  std::__cxx11::string::operator=
            ((string *)(moduleInCMakeModulePath.field_2._M_local_buf + 8),(string *)psVar5);
  std::__cxx11::string::operator+=
            ((string *)(moduleInCMakeModulePath.field_2._M_local_buf + 8),"/Modules/");
  std::__cxx11::string::operator+=
            ((string *)(moduleInCMakeModulePath.field_2._M_local_buf + 8),filename);
  cmsys::SystemTools::ConvertToUnixSlashes((string *)((long)&moduleInCMakeModulePath.field_2 + 8));
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileExists(pcVar3);
  if (!bVar1) {
    std::__cxx11::string::operator=((string *)(moduleInCMakeModulePath.field_2._M_local_buf + 8),"")
    ;
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&cmakeModulePath);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) != 0) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               (string *)(moduleInCMakeModulePath.field_2._M_local_buf + 8));
  }
  uVar6 = std::__cxx11::string::empty();
  if (((uVar6 & 1) != 0) || (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) != 0))
  goto LAB_0059b3fa;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_148,"CMAKE_CURRENT_LIST_FILE",
             (allocator *)(mods.field_2._M_local_buf + 0xf));
  pcVar3 = GetDefinition(this,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)(mods.field_2._M_local_buf + 0xf));
  local_128 = pcVar3;
  psVar5 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                 psVar5,"/Modules/");
  pcVar3 = local_128;
  local_3b9 = false;
  if (local_128 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_190,pcVar3,&local_191);
    local_3b9 = cmsys::SystemTools::IsSubDirectory(&local_190,(string *)local_170);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator((allocator<char> *)&local_191);
  }
  if (local_3b9 != false) {
    PVar2 = GetPolicyStatus(this,CMP0017);
    if (PVar2 != OLD) {
      if (PVar2 != WARN) {
        if (PVar2 - NEW < 3) {
          std::__cxx11::string::operator=
                    ((string *)__return_storage_ptr__,
                     (string *)(moduleInCMakeModulePath.field_2._M_local_buf + 8));
        }
        goto LAB_0059b3de;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_310);
      poVar7 = std::operator<<((ostream *)local_310,"File ");
      poVar7 = std::operator<<(poVar7,local_128);
      poVar7 = std::operator<<(poVar7," includes ");
      poVar7 = std::operator<<(poVar7,(string *)&cmakeModulePath);
      poVar7 = std::operator<<(poVar7," (found via CMAKE_MODULE_PATH) which shadows ");
      poVar7 = std::operator<<(poVar7,(string *)(moduleInCMakeModulePath.field_2._M_local_buf + 8));
      poVar7 = std::operator<<(poVar7,". This may cause errors later on .\n");
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_330,(cmPolicies *)0x11,id);
      std::operator<<(poVar7,(string *)&local_330);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::ostringstream::str();
      IssueMessage(this,AUTHOR_WARNING,&local_350);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_310);
    }
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&cmakeModulePath);
  }
LAB_0059b3de:
  std::__cxx11::string::~string((string *)local_170);
LAB_0059b3fa:
  currentFile._4_4_ = 1;
  std::__cxx11::string::~string((string *)&cmakeModulePath);
  std::__cxx11::string::~string((string *)(moduleInCMakeModulePath.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefile::GetModulesFile(const char* filename) const
{
  std::string result;

  // We search the module always in CMAKE_ROOT and in CMAKE_MODULE_PATH,
  // and then decide based on the policy setting which one to return.
  // See CMP0017 for more details.
  // The specific problem was that KDE 4.5.0 installs a
  // FindPackageHandleStandardArgs.cmake which doesn't have the new features
  // of FPHSA.cmake introduced in CMake 2.8.3 yet, and by setting
  // CMAKE_MODULE_PATH also e.g. FindZLIB.cmake from cmake included
  // FPHSA.cmake from kdelibs and not from CMake, and tried to use the
  // new features, which were not there in the version from kdelibs, and so
  // failed ("
  std::string moduleInCMakeRoot;
  std::string moduleInCMakeModulePath;

  // Always search in CMAKE_MODULE_PATH:
  const char* cmakeModulePath = this->GetDefinition("CMAKE_MODULE_PATH");
  if (cmakeModulePath) {
    std::vector<std::string> modulePath;
    cmSystemTools::ExpandListArgument(cmakeModulePath, modulePath);

    // Look through the possible module directories.
    for (std::vector<std::string>::iterator i = modulePath.begin();
         i != modulePath.end(); ++i) {
      std::string itempl = *i;
      cmSystemTools::ConvertToUnixSlashes(itempl);
      itempl += "/";
      itempl += filename;
      if (cmSystemTools::FileExists(itempl.c_str())) {
        moduleInCMakeModulePath = itempl;
        break;
      }
    }
  }

  // Always search in the standard modules location.
  moduleInCMakeRoot = cmSystemTools::GetCMakeRoot();
  moduleInCMakeRoot += "/Modules/";
  moduleInCMakeRoot += filename;
  cmSystemTools::ConvertToUnixSlashes(moduleInCMakeRoot);
  if (!cmSystemTools::FileExists(moduleInCMakeRoot.c_str())) {
    moduleInCMakeRoot = "";
  }

  // Normally, prefer the files found in CMAKE_MODULE_PATH. Only when the file
  // from which we are being called is located itself in CMAKE_ROOT, then
  // prefer results from CMAKE_ROOT depending on the policy setting.
  result = moduleInCMakeModulePath;
  if (result.empty()) {
    result = moduleInCMakeRoot;
  }

  if (!moduleInCMakeModulePath.empty() && !moduleInCMakeRoot.empty()) {
    const char* currentFile = this->GetDefinition("CMAKE_CURRENT_LIST_FILE");
    std::string mods = cmSystemTools::GetCMakeRoot() + "/Modules/";
    if (currentFile && cmSystemTools::IsSubDirectory(currentFile, mods)) {
      switch (this->GetPolicyStatus(cmPolicies::CMP0017)) {
        case cmPolicies::WARN: {
          std::ostringstream e;
          /* clang-format off */
          e << "File " << currentFile << " includes "
            << moduleInCMakeModulePath
            << " (found via CMAKE_MODULE_PATH) which shadows "
            << moduleInCMakeRoot  << ". This may cause errors later on .\n"
            << cmPolicies::GetPolicyWarning(cmPolicies::CMP0017);
          /* clang-format on */

          this->IssueMessage(cmake::AUTHOR_WARNING, e.str());
          CM_FALLTHROUGH;
        }
        case cmPolicies::OLD:
          result = moduleInCMakeModulePath;
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          result = moduleInCMakeRoot;
          break;
      }
    }
  }

  return result;
}